

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void game::userTurn(Game *game)

{
  ostream *poVar1;
  char *pcVar2;
  int i;
  int j;
  uint local_40;
  uint local_3c;
  Game *local_38;
  
  local_40 = 0;
  local_38 = game;
  do {
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<(poVar1,"X:  ");
    std::istream::operator>>((istream *)&std::cin,(int *)&local_40);
    pcVar2 = anon_var_dwarf_2192;
    if (local_40 < 3) {
      while( true ) {
        poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::operator<<(poVar1,"Y:  ");
        std::istream::operator>>((istream *)&std::cin,(int *)&local_3c);
        if (local_3c < 3) break;
        poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21b2);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      pcVar2 = anon_var_dwarf_21bc;
      if (local_38->bord[(int)local_40][(int)local_3c] == ' ') {
        local_38->bord[(int)local_40][(int)local_3c] = local_38->userChar;
        return;
      }
    }
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  } while( true );
}

Assistant:

void userTurn(Game *game){
        int i = 0,j;
        bool flag_i = true, flag_j = true, flag_all = true;
        while (flag_all) {
            while (flag_i) {
                std::cout << std::endl << "X:  ";
                std::cin >> i;
                if ((i < 0) || (i > 2)) {
                    std::cout << "Введите x корректно" << std::endl;
                } else {
                    flag_i = false;
                }
            }

            while (flag_j) {
                std::cout << std::endl << "Y:  ";
                std::cin >> j;
                if ((j < 0) || (j > 2)) {
                    std::cout << "Введите y корректно" << std::endl;
                } else {
                    flag_j = false;
                }
            }
            if (game->bord[i][j] == ' '){
                flag_all = false;
            }else{
                std::cout << "Не жульничайте" << std::endl;
                flag_i = true;
                flag_j = true;
            }
        }
        game->bord[i][j] = game->userChar;
    }